

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

boolean can_carry(monst *mtmp,obj *otmp)

{
  uint uVar1;
  permonst *ptr;
  boolean bVar2;
  int iVar3;
  int iVar4;
  permonst *mdat;
  int newload;
  int otyp;
  obj *otmp_local;
  monst *mtmp_local;
  
  iVar3 = (int)otmp->otyp;
  uVar1 = otmp->owt;
  ptr = mtmp->data;
  if ((ptr->mflags1 & 0x800) == 0) {
    if (((iVar3 == 0x10e) &&
        (((((long)otmp->corpsenm & 0x3ffffffffffffffU) == 0xc ||
          (((long)otmp->corpsenm & 0x3ffffffffffffffU) == 0xb)) &&
         ((mtmp->misc_worn_check & 0x10U) == 0)))) && ((mtmp->mintrinsics & 0x80) == 0)) {
      mtmp_local._7_1_ = false;
    }
    else if ((iVar3 == 0x10e) &&
            (((((long)otmp->corpsenm & 0x3ffffffffffffffU) == 0x144 ||
              (((long)otmp->corpsenm & 0x3ffffffffffffffU) == 0x146)) ||
             (((long)otmp->corpsenm & 0x3ffffffffffffffU) == 0x145)))) {
      mtmp_local._7_1_ = false;
    }
    else {
      if ((((*(ushort *)&objects[iVar3].field_0x11 >> 4 & 0x1f) == 0xe) &&
          (bVar2 = hates_silver(ptr), bVar2 != '\0')) &&
         ((iVar3 != 0x10c || ((ptr->mflags3 & 0x1f) == 0)))) {
        return '\0';
      }
      if (mtmp == u.usteed) {
        mtmp_local._7_1_ = false;
      }
      else if ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0) {
        if (((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) || (mtmp->mtame != '\0')) {
          if ((((ptr->mflags2 & 0x8000000) == 0) &&
              (((((mtmp->data->msound != '\x1f' && (mtmp->data != mons + 0x11b)) &&
                 (mtmp->data != mons + 0x144)) &&
                ((mtmp->data != mons + 0x146 && (mtmp->data != mons + 0x145)))) ||
               ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0)))) || (iVar3 != 0x214)) {
            if (ptr->mlet == '\x0e') {
              mtmp_local._7_1_ = otmp->oclass != '\x0e';
            }
            else {
              iVar3 = curr_mon_load(mtmp);
              iVar4 = max_mon_load(mtmp);
              if (iVar4 < (int)(iVar3 + uVar1)) {
                mtmp_local._7_1_ = false;
              }
              else {
                mtmp_local._7_1_ = true;
              }
            }
          }
          else {
            mtmp_local._7_1_ = true;
          }
        }
        else {
          mtmp_local._7_1_ = false;
        }
      }
      else {
        mtmp_local._7_1_ = true;
      }
    }
  }
  else {
    mtmp_local._7_1_ = false;
  }
  return mtmp_local._7_1_;
}

Assistant:

boolean can_carry(struct monst *mtmp, struct obj *otmp)
{
	int otyp = otmp->otyp, newload = otmp->owt;
	const struct permonst *mdat = mtmp->data;

	if (notake(mdat)) return FALSE;		/* can't carry anything */

	if (otyp == CORPSE && touch_petrifies(&mons[otmp->corpsenm]) &&
		!(mtmp->misc_worn_check & W_ARMG) && !resists_ston(mtmp))
	    return FALSE;
	if (otyp == CORPSE && is_rider(&mons[otmp->corpsenm]))
	    return FALSE;
	if (objects[otyp].oc_material == SILVER && hates_silver(mdat) &&
		(otyp != BELL_OF_OPENING || !is_covetous(mdat)))
	    return FALSE;

	/* Steeds don't pick up stuff (to avoid shop abuse) */
	if (mtmp == u.usteed) return FALSE;
	if (mtmp->isshk) return TRUE; /* no limit */
	if (mtmp->mpeaceful && !mtmp->mtame) return FALSE;
	/* otherwise players might find themselves obligated to violate
	 * their alignment if the monster takes something they need
	 */

	/* special--boulder throwers carry unlimited amounts of boulders
	 * and some monsters can shatter boulders (will be handled in mpickstuff)
	 */
	if ((throws_rocks(mdat) || is_rockbreaker(mtmp)) && otyp == BOULDER)
		return TRUE;

	/* nymphs deal in stolen merchandise, but not boulders or statues */
	if (mdat->mlet == S_NYMPH)
		return (boolean)(otmp->oclass != ROCK_CLASS);

	if (curr_mon_load(mtmp) + newload > max_mon_load(mtmp)) return FALSE;

	return TRUE;
}